

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.h
# Opt level: O2

void __thiscall PointToPoint::kernel(PointToPoint *this,int param_1,int it)

{
  int iVar1;
  int i;
  uint uVar2;
  MPI_Request *ppoVar3;
  
  ppoVar3 = (this->super_HalosExchange).reqs;
  for (uVar2 = 0; iVar1 = (this->super_HalosExchange).n_partners, (int)uVar2 < iVar1;
      uVar2 = uVar2 + 1) {
    (*(this->super_HalosExchange).super_Computation._vptr_Computation[7])
              (this,(ulong)uVar2,ppoVar3,ppoVar3 + 1,0);
    ppoVar3 = ppoVar3 + 2;
  }
  MPI_Waitall(iVar1 * 2,(this->super_HalosExchange).reqs,0);
  return;
}

Assistant:

inline void kernel(int, int it) override
    {
#ifdef DEBUG_MODE
        fill_sbuf(it);
#endif
        // pointer to the first request.
        auto* rq = reqs;
        for (int i = 0; i < n_partners; i++)
        {
            // As long as there is a waitall between iterations, we do not need
            // to use incremental tags across iterations.
            sendrecv(i, rq, rq + 1, 0);
            rq += 2;
        }

        MPI_Waitall(2 * n_partners, reqs, MPI_STATUSES_IGNORE);
#ifdef DEBUG_MODE
        for (int i = 0; i < n_partners; i++)
            check_rbuf(i, it);
#endif
    }